

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O1

KFIXED8_3 * __thiscall KDIS::DATA_TYPE::LE_EulerAngles::operator[](LE_EulerAngles *this,KUINT16 i)

{
  KException *this_00;
  KString local_40;
  
  if (i < 3) {
    return (KFIXED8_3 *)
           ((long)&(this->super_DataTypeBase)._vptr_DataTypeBase + (ulong)((i & 0xfff) << 4 | 8));
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"operator[]","");
  KException::KException(this_00,&local_40,7);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

KFIXED8_3 &LE_EulerAngles::operator[](KUINT16 i) noexcept(false)
{
    switch( i )
    {
    case 0:
        return m_Psi;
    case 1:
        return m_Theta;
    case 2:
        return m_Phi;
    default:
        throw KException( __FUNCTION__, OUT_OF_BOUNDS );
    }
}